

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPSources::SenderTimeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  bool bVar1;
  RTPInternalSourceData **ppRVar2;
  RTPTime local_48;
  RTPTime lastrtppacktime;
  RTPInternalSourceData *srcdat;
  RTPTime checktime;
  int local_28;
  int newactivecount;
  int newsendercount;
  int newtotalcount;
  RTPTime *timeoutdelay_local;
  RTPTime *curtime_local;
  RTPSources *this_local;
  
  newactivecount = 0;
  local_28 = 0;
  checktime.m_t._4_4_ = 0;
  srcdat = (RTPInternalSourceData *)curtime->m_t;
  RTPTime::operator-=((RTPTime *)&srcdat,timeoutdelay);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::GotoFirstElement(&this->sourcelist);
  while (bVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
                 ::HasCurrentElement(&this->sourcelist), bVar1) {
    ppRVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
              ::GetCurrentElement(&this->sourcelist);
    lastrtppacktime.m_t = (double)*ppRVar2;
    newactivecount = newactivecount + 1;
    bVar1 = RTPSourceData::IsActive((RTPSourceData *)lastrtppacktime.m_t);
    if (bVar1) {
      checktime.m_t._4_4_ = checktime.m_t._4_4_ + 1;
    }
    bVar1 = RTPSourceData::IsSender((RTPSourceData *)lastrtppacktime.m_t);
    if (bVar1) {
      local_48 = RTPSourceData::INF_GetLastRTPPacketTime(lastrtppacktime.m_t);
      bVar1 = RTPTime::operator<(&local_48,(RTPTime *)&srcdat);
      if (bVar1) {
        RTPInternalSourceData::ClearSenderFlag((RTPInternalSourceData *)lastrtppacktime.m_t);
        this->sendercount = this->sendercount + -1;
      }
      else {
        local_28 = local_28 + 1;
      }
    }
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
    ::GotoNextElement(&this->sourcelist);
  }
  this->totalcount = newactivecount;
  this->sendercount = local_28;
  this->activecount = checktime.m_t._4_4_;
  return;
}

Assistant:

void RTPSources::SenderTimeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();

		newtotalcount++;
		if (srcdat->IsActive())
			newactivecount++;

		if (srcdat->IsSender())
		{
			RTPTime lastrtppacktime = srcdat->INF_GetLastRTPPacketTime();

			if (lastrtppacktime < checktime) // timeout
			{
				srcdat->ClearSenderFlag();
				sendercount--;
			}
			else
				newsendercount++;
		}
		sourcelist.GotoNextElement();
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}